

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::DiffComplex<KVEntryUint32>::printJson
          (DiffComplex<KVEntryUint32> *this,size_t index,PrintIndent *out,int indent,char *space,
          char *nl)

{
  char *in_stack_00000038;
  int in_stack_00000044;
  PrintIndent *in_stack_00000048;
  KVEntryUint32 *in_stack_00000050;
  
  std::optional<KVEntryUint32>::operator->((optional<KVEntryUint32> *)0x16f87b);
  CommandCompare::compareKVEntry(ktx::PrintDiff&,std::basic_string_view<char,std::
  char_traits<char>>const&,ktxKVListEntry*,ktxKVListEntry*)::KVEntryUint32::printJson(ktx::
  PrintIndent__int_char_const__char_const___const
            (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000038,(char *)this);
  return;
}

Assistant:

void printJson(std::size_t index, PrintIndent& out, int indent, const char* space, const char* nl) const {
        values[index]->printJson(out, indent, space, nl);
    }